

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O2

void phyr::parallelInit(void)

{
  int iVar1;
  thread *__stat_loc;
  long in_FS_OFFSET;
  int local_50;
  int nThreads;
  thread local_48;
  shared_ptr<phyr::Barrier> barrier;
  
  nThreads = numSystemCores();
  __stat_loc = (thread *)&nThreads;
  *(undefined4 *)(in_FS_OFFSET + -0x13a8) = 0;
  std::make_shared<phyr::Barrier,int&>((int *)&barrier);
  for (iVar1 = 1; iVar1 + -1 < nThreads + -1; iVar1 = iVar1 + 1) {
    local_50 = iVar1;
    std::thread::
    thread<void(&)(int,std::shared_ptr<phyr::Barrier>),int,std::shared_ptr<phyr::Barrier>&,void>
              (&local_48,workerThreadFunc,&local_50,&barrier);
    __stat_loc = &local_48;
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((vector<std::thread,_std::allocator<std::thread>_> *)&threads,&local_48);
    std::thread::~thread(&local_48);
  }
  Barrier::wait(barrier.super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                __stat_loc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&barrier.super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

int maxThreadIndex() { return numSystemCores(); }